

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall
QCss::ValueExtractor::extractPalette
          (ValueExtractor *this,QBrush *foreground,QBrush *selectedForeground,
          QBrush *selectedBackground,QBrush *alternateBackground,QBrush *placeHolderTextForeground,
          QBrush *accent)

{
  long lVar1;
  long lVar2;
  qsizetype qVar3;
  DeclarationData *pDVar4;
  QList<QCss::Declaration> *in_RDI;
  Declaration *in_R9;
  long in_FS_OFFSET;
  Declaration *decl;
  int i;
  bool hit;
  QBrush *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  Property in_stack_ffffffffffffff74;
  int iVar5;
  uint3 in_stack_ffffffffffffff94;
  uint uVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (uint)in_stack_ffffffffffffff94;
  iVar5 = 0;
  do {
    lVar2 = (long)iVar5;
    qVar3 = QList<QCss::Declaration>::size(in_RDI);
    if (qVar3 <= lVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return (bool)((byte)(uVar6 >> 0x18) & 1);
    }
    QList<QCss::Declaration>::at
              ((QList<QCss::Declaration> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (qsizetype)in_stack_ffffffffffffff68);
    pDVar4 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa33b2b
                       );
    in_stack_ffffffffffffff74 = pDVar4->propertyId;
    if (in_stack_ffffffffffffff74 == Color) {
      Declaration::brushValue(in_R9,(QPalette *)CONCAT44(uVar6,iVar5));
      QBrush::operator=((QBrush *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff68);
      QBrush::~QBrush((QBrush *)0xa33bc1);
LAB_00a33cd9:
      uVar6 = CONCAT13(1,(int3)uVar6);
    }
    else {
      if (in_stack_ffffffffffffff74 == QtSelectionForeground) {
        Declaration::brushValue(in_R9,(QPalette *)CONCAT44(uVar6,iVar5));
        QBrush::operator=((QBrush *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff68);
        QBrush::~QBrush((QBrush *)0xa33c00);
        goto LAB_00a33cd9;
      }
      if (in_stack_ffffffffffffff74 == QtSelectionBackground) {
        Declaration::brushValue(in_R9,(QPalette *)CONCAT44(uVar6,iVar5));
        QBrush::operator=((QBrush *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff68);
        QBrush::~QBrush((QBrush *)0xa33c36);
        goto LAB_00a33cd9;
      }
      if (in_stack_ffffffffffffff74 == QtAlternateBackground) {
        Declaration::brushValue(in_R9,(QPalette *)CONCAT44(uVar6,iVar5));
        QBrush::operator=((QBrush *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff68);
        QBrush::~QBrush((QBrush *)0xa33c6c);
        goto LAB_00a33cd9;
      }
      if (in_stack_ffffffffffffff74 == QtPlaceHolderTextColor) {
        Declaration::brushValue(in_R9,(QPalette *)CONCAT44(uVar6,iVar5));
        QBrush::operator=((QBrush *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff68);
        QBrush::~QBrush((QBrush *)0xa33c9f);
        goto LAB_00a33cd9;
      }
      if (in_stack_ffffffffffffff74 == QtAccent) {
        Declaration::brushValue(in_R9,(QPalette *)CONCAT44(uVar6,iVar5));
        QBrush::operator=((QBrush *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff68);
        QBrush::~QBrush((QBrush *)0xa33cd5);
        goto LAB_00a33cd9;
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

bool ValueExtractor::extractPalette(QBrush *foreground,
                                    QBrush *selectedForeground,
                                    QBrush *selectedBackground,
                                    QBrush *alternateBackground,
                                    QBrush *placeHolderTextForeground,
                                    QBrush *accent)
{
    bool hit = false;
    for (int i = 0; i < declarations.size(); ++i) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case Color: *foreground = decl.brushValue(pal); break;
        case QtSelectionForeground: *selectedForeground = decl.brushValue(pal); break;
        case QtSelectionBackground: *selectedBackground = decl.brushValue(pal); break;
        case QtAlternateBackground: *alternateBackground = decl.brushValue(pal); break;
        case QtPlaceHolderTextColor: *placeHolderTextForeground = decl.brushValue(pal); break;
        case QtAccent: *accent = decl.brushValue(pal); break;
        default: continue;
        }
        hit = true;
    }
    return hit;
}